

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool __thiscall
libaom_examples::anon_unknown_0::ParsedValue::ValueAsFloatingPoint
          (ParsedValue *this,int line_idx,double *v)

{
  double *in_RDX;
  uint in_ESI;
  int *in_RDI;
  double local_30;
  bool local_1;
  
  if (*in_RDI == 0) {
    fprintf(_stderr,"No value found where floating point value was expected at line %d\n",
            (ulong)in_ESI);
    local_1 = false;
  }
  else {
    if (*in_RDI == 2) {
      local_30 = *(double *)(in_RDI + 4);
    }
    else {
      local_30 = (double)*(long *)(in_RDI + 2);
    }
    *in_RDX = local_30;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ValueAsFloatingPoint(int line_idx, double *v) {
    if (type_ == Type::kNone) {
      fprintf(
          stderr,
          "No value found where floating point value was expected at line %d\n",
          line_idx);
      return false;
    }
    *v = (type_ == Type::kFloatingPoint) ? double_value_
                                         : static_cast<double>(int_value_);
    return true;
  }